

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

int midi_message_length(PmMessage message)

{
  uint uVar1;
  int local_c;
  PmMessage message_local;
  
  uVar1 = message & 0xff;
  if (uVar1 < 0x80) {
    local_c = 0;
  }
  else if (uVar1 < 0xf0) {
    local_c = midi_message_length::length[(int)(uVar1 - 0x80) >> 4];
  }
  else {
    local_c = midi_message_length::length_1[(int)(uVar1 - 0xf0)];
  }
  return local_c;
}

Assistant:

static int midi_message_length(PmMessage message)
{
    message &= 0xff;
    if (message < 0x80) {
        return 0;
    } else if (message < 0xf0) {
        static const int length[] = {3, 3, 3, 3, 2, 2, 3};
        return length[(message - 0x80) >> 4];
    } else {
        static const int length[] = {
            -1, 2, 3, 2, 0, 0, 1, -1, 1, 0, 1, 1, 1, 0, 1, 1};
        return length[message - 0xf0];
    }
}